

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_paged_audio_buffer_data_allocate_page
                    (ma_paged_audio_buffer_data *pData,ma_uint64 pageSizeInFrames,void *pInitialData
                    ,ma_allocation_callbacks *pAllocationCallbacks,
                    ma_paged_audio_buffer_page **ppPage)

{
  ma_format mVar1;
  ma_uint32 mVar2;
  long lVar3;
  undefined8 *frameCount;
  void *in_RCX;
  long in_RDX;
  long in_RSI;
  ma_format *in_RDI;
  undefined8 *in_R8;
  ma_uint64 allocationSize;
  ma_paged_audio_buffer_page *pPage;
  size_t in_stack_ffffffffffffffa8;
  ma_result local_c;
  
  if (in_R8 == (undefined8 *)0x0) {
    local_c = MA_INVALID_ARGS;
  }
  else {
    *in_R8 = 0;
    if (in_RDI == (ma_format *)0x0) {
      local_c = MA_INVALID_ARGS;
    }
    else {
      mVar1 = in_RDI[1];
      mVar2 = ma_get_bytes_per_sample(*in_RDI);
      lVar3 = in_RSI * (ulong)(mVar2 * mVar1) + 0x18;
      frameCount = (undefined8 *)
                   ma_malloc(in_stack_ffffffffffffffa8,(ma_allocation_callbacks *)0x1de40c);
      if (frameCount == (undefined8 *)0x0) {
        local_c = MA_OUT_OF_MEMORY;
      }
      else {
        *frameCount = 0;
        frameCount[1] = in_RSI;
        if (in_RDX != 0) {
          ma_copy_pcm_frames(in_RCX,in_R8,(ma_uint64)frameCount,(ma_format)((ulong)lVar3 >> 0x20),
                             (ma_uint32)lVar3);
        }
        *in_R8 = frameCount;
        local_c = MA_SUCCESS;
      }
    }
  }
  return local_c;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_data_allocate_page(ma_paged_audio_buffer_data* pData, ma_uint64 pageSizeInFrames, const void* pInitialData, const ma_allocation_callbacks* pAllocationCallbacks, ma_paged_audio_buffer_page** ppPage)
{
    ma_paged_audio_buffer_page* pPage;
    ma_uint64 allocationSize;

    if (ppPage == NULL) {
        return MA_INVALID_ARGS;
    }

    *ppPage = NULL;

    if (pData == NULL) {
        return MA_INVALID_ARGS;
    }

    allocationSize = sizeof(*pPage) + (pageSizeInFrames * ma_get_bytes_per_frame(pData->format, pData->channels));
    if (allocationSize > MA_SIZE_MAX) {
        return MA_OUT_OF_MEMORY;    /* Too big. */
    }

    pPage = (ma_paged_audio_buffer_page*)ma_malloc((size_t)allocationSize, pAllocationCallbacks);   /* Safe cast to size_t. */
    if (pPage == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    pPage->pNext = NULL;
    pPage->sizeInFrames = pageSizeInFrames;

    if (pInitialData != NULL) {
        ma_copy_pcm_frames(pPage->pAudioData, pInitialData, pageSizeInFrames, pData->format, pData->channels);
    }

    *ppPage = pPage;

    return MA_SUCCESS;
}